

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_start(ConsoleReporter *this,TestCaseData *in)

{
  undefined8 in_RSI;
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x68) = in_RSI;
  std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::clear
            ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
             0x12124d);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            hasLoggedCurrentTestStart = false;
            tc                        = &in;
            subcasesStack.clear();
            currentSubcaseLevel = 0;
        }